

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

ssize_t __thiscall Database::read(Database *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  NodeData *pNVar2;
  char *slice;
  NodeData result;
  PolarString *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pthread_rwlock_rdlock((pthread_rwlock_t *)this);
  pNVar2 = IndexTree::search((IndexTree *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8);
  uVar1._0_4_ = pNVar2->slice;
  uVar1._4_4_ = pNVar2->offset;
  if ((undefined4)uVar1 != -1) {
    std::__cxx11::string::assign
              ((char *)__buf,(ulong)(this->slices[(int)(undefined4)uVar1] + (uVar1 >> 0x20)));
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  else {
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return (ulong)((undefined4)uVar1 == -1);
}

Assistant:

RetCode Database::read(const PolarString &key, std::string *value) {
    pthread_rwlock_rdlock(&rwlock);
//    printf("DB Shard %d read %s\n", id, key.data());
    auto result = index->search(key);
    if (__glibc_unlikely(result.slice == -1)) {
        pthread_rwlock_unlock(&rwlock);
//        printf("Not Found\n");
        return polar_race::kNotFound;
    }
    auto slice = slices[result.slice];
    value->assign(slice + result.offset, result.length);
//    printf("Found %s\n", value->c_str());
    pthread_rwlock_unlock(&rwlock);
    return polar_race::kSucc;
}